

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::ExceptionInfoRequest>::~BasicTypeInfo
          (BasicTypeInfo<dap::ExceptionInfoRequest> *this)

{
  ~BasicTypeInfo(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

constexpr BasicTypeInfo(std::string&& name) : name_(std::move(name)) {}